

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFObjectHandle.cc
# Opt level: O2

bool __thiscall QPDFObjectHandle::getValueAsUTF8(QPDFObjectHandle *this,string *value)

{
  QPDF_String *this_00;
  string sStack_38;
  
  this_00 = ::qpdf::BaseHandle::as<QPDF_String>(&this->super_BaseHandle);
  if (this_00 != (QPDF_String *)0x0) {
    QPDF_String::getUTF8Val_abi_cxx11_(&sStack_38,this_00);
    std::__cxx11::string::operator=((string *)value,(string *)&sStack_38);
    std::__cxx11::string::~string((string *)&sStack_38);
  }
  return this_00 != (QPDF_String *)0x0;
}

Assistant:

bool
QPDFObjectHandle::getValueAsUTF8(std::string& value) const
{
    if (auto str = as<QPDF_String>()) {
        value = str->getUTF8Val();
        return true;
    }
    return false;
}